

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O0

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  WritableFile *pWVar1;
  int iVar2;
  char *ptr_00;
  Slice *length;
  Slice *pSVar3;
  undefined8 in_RDX;
  Writer *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  bool end;
  RecordType type;
  size_t fragment_length;
  size_t avail;
  int leftover;
  bool begin;
  size_t left;
  char *ptr;
  Status *s;
  Slice *in_stack_ffffffffffffff48;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  Slice *in_stack_ffffffffffffff58;
  Writer *this_00;
  undefined1 local_20 [16];
  undefined1 local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RSI;
  ptr_00 = Slice::data(in_stack_ffffffffffffff48);
  length = (Slice *)Slice::size(in_stack_ffffffffffffff48);
  Status::Status((Status *)in_stack_ffffffffffffff48);
  while( true ) {
    iVar2 = 0x8000 - in_RSI->block_offset_;
    if (iVar2 < 0) {
      __assert_fail("leftover >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                    ,0x2d,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (iVar2 < 7) {
      if (0 < iVar2) {
        pWVar1 = in_RSI->dest_;
        Slice::Slice(in_stack_ffffffffffffff58,
                     (char *)CONCAT17(in_stack_ffffffffffffff57,
                                      CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50))
                     ,(size_t)in_stack_ffffffffffffff48);
        (*pWVar1->_vptr_WritableFile[2])(local_10,pWVar1,local_20);
        Status::~Status((Status *)in_stack_ffffffffffffff48);
      }
      in_RSI->block_offset_ = 0;
    }
    if (0x7ff9 - in_RSI->block_offset_ < 0) break;
    pSVar3 = (Slice *)(long)(0x7ff9 - in_RSI->block_offset_);
    if (length < pSVar3) {
      pSVar3 = length;
    }
    in_stack_ffffffffffffff58 = pSVar3;
    EmitPhysicalRecord(this_00,(RecordType)((ulong)in_RDX >> 0x20),ptr_00,(size_t)length);
    Status::operator=((Status *)in_stack_ffffffffffffff58,
                      (Status *)
                      CONCAT17(in_stack_ffffffffffffff57,
                               CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)));
    Status::~Status((Status *)in_stack_ffffffffffffff48);
    ptr_00 = ptr_00 + (long)&pSVar3->data_;
    length = (Slice *)((long)length - (long)pSVar3);
    in_stack_ffffffffffffff57 = Status::ok((Status *)in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff56 = (bool)in_stack_ffffffffffffff57 && length != (Slice *)0x0;
    if (!(bool)in_stack_ffffffffffffff57 || length == (Slice *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return (Status)in_RDI;
    }
  }
  __assert_fail("kBlockSize - block_offset_ - kHeaderSize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/log_writer.cc"
                ,0x39,"Status leveldb::log::Writer::AddRecord(const Slice &)");
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}